

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMU.cpp
# Opt level: O0

void __thiscall RTIMU::calibrateAverageCompass(RTIMU *this)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  RTFLOAT RVar5;
  RTFLOAT RVar6;
  RTFLOAT RVar7;
  undefined1 local_34 [8];
  RTVector3 ev;
  int i_2;
  int i_1;
  float magMaxDelta;
  int i;
  float delta;
  bool changed;
  RTIMU *this_local;
  
  if (((this->m_compassCalibrationMode & 1U) == 0) &&
     ((this->m_settings->m_compassCalValid & 1U) == 0)) {
    fVar1 = this->m_runtimeMagCalMax[0];
    RVar5 = RTVector3::x(&(this->m_imuData).compass);
    bVar4 = fVar1 < RVar5;
    if (bVar4) {
      RVar5 = RTVector3::x(&(this->m_imuData).compass);
      this->m_runtimeMagCalMax[0] = RVar5;
    }
    fVar1 = this->m_runtimeMagCalMax[1];
    RVar5 = RTVector3::y(&(this->m_imuData).compass);
    bVar3 = fVar1 < RVar5;
    if (bVar3) {
      RVar5 = RTVector3::y(&(this->m_imuData).compass);
      this->m_runtimeMagCalMax[1] = RVar5;
    }
    i._3_1_ = bVar3 || bVar4;
    fVar1 = this->m_runtimeMagCalMax[2];
    RVar5 = RTVector3::z(&(this->m_imuData).compass);
    if (fVar1 < RVar5) {
      RVar5 = RTVector3::z(&(this->m_imuData).compass);
      this->m_runtimeMagCalMax[2] = RVar5;
      i._3_1_ = true;
    }
    fVar1 = this->m_runtimeMagCalMin[0];
    RVar5 = RTVector3::x(&(this->m_imuData).compass);
    if (RVar5 < fVar1) {
      RVar5 = RTVector3::x(&(this->m_imuData).compass);
      this->m_runtimeMagCalMin[0] = RVar5;
      i._3_1_ = true;
    }
    fVar1 = this->m_runtimeMagCalMin[1];
    RVar5 = RTVector3::y(&(this->m_imuData).compass);
    if (RVar5 < fVar1) {
      RVar5 = RTVector3::y(&(this->m_imuData).compass);
      this->m_runtimeMagCalMin[1] = RVar5;
      i._3_1_ = true;
    }
    fVar1 = this->m_runtimeMagCalMin[2];
    RVar5 = RTVector3::z(&(this->m_imuData).compass);
    if (RVar5 < fVar1) {
      RVar5 = RTVector3::z(&(this->m_imuData).compass);
      this->m_runtimeMagCalMin[2] = RVar5;
      i._3_1_ = true;
    }
    if (i._3_1_) {
      if ((this->m_runtimeMagCalValid & 1U) == 0) {
        this->m_runtimeMagCalValid = true;
        for (i_1 = 0; i_1 < 3; i_1 = i_1 + 1) {
          if (((this->m_runtimeMagCalMax[i_1] - this->m_runtimeMagCalMin[i_1] < 30.0) ||
              (0.0 < this->m_runtimeMagCalMin[i_1])) ||
             (this->m_runtimeMagCalMax[i_1] <= 0.0 && this->m_runtimeMagCalMax[i_1] != 0.0)) {
            this->m_runtimeMagCalValid = false;
            break;
          }
        }
      }
      if ((this->m_runtimeMagCalValid & 1U) != 0) {
        i_2 = -0x40800000;
        for (ev.m_data[2] = 0.0; (int)ev.m_data[2] < 3;
            ev.m_data[2] = (RTFLOAT)((int)ev.m_data[2] + 1)) {
          if ((float)i_2 <
              this->m_runtimeMagCalMax[(int)ev.m_data[2]] -
              this->m_runtimeMagCalMin[(int)ev.m_data[2]]) {
            i_2 = (int)(this->m_runtimeMagCalMax[(int)ev.m_data[2]] -
                       this->m_runtimeMagCalMin[(int)ev.m_data[2]]);
          }
        }
        for (ev.m_data[1] = 0.0; (int)ev.m_data[1] < 3;
            ev.m_data[1] = (RTFLOAT)((int)ev.m_data[1] + 1)) {
          this->m_compassCalScale[(int)ev.m_data[1]] =
               ((float)i_2 / 2.0) /
               ((this->m_runtimeMagCalMax[(int)ev.m_data[1]] -
                this->m_runtimeMagCalMin[(int)ev.m_data[1]]) / 2.0);
          this->m_compassCalOffset[(int)ev.m_data[1]] =
               (this->m_runtimeMagCalMax[(int)ev.m_data[1]] +
               this->m_runtimeMagCalMin[(int)ev.m_data[1]]) / 2.0;
        }
      }
    }
  }
  bVar4 = getCompassCalibrationValid(this);
  if ((bVar4) || (bVar4 = getRuntimeCompassCalibrationValid(this), bVar4)) {
    RVar5 = RTVector3::x(&(this->m_imuData).compass);
    RTVector3::setX(&(this->m_imuData).compass,
                    (RVar5 - this->m_compassCalOffset[0]) * this->m_compassCalScale[0]);
    RVar5 = RTVector3::y(&(this->m_imuData).compass);
    RTVector3::setY(&(this->m_imuData).compass,
                    (RVar5 - this->m_compassCalOffset[1]) * this->m_compassCalScale[1]);
    RVar5 = RTVector3::z(&(this->m_imuData).compass);
    RTVector3::setZ(&(this->m_imuData).compass,
                    (RVar5 - this->m_compassCalOffset[2]) * this->m_compassCalScale[2]);
    if ((this->m_settings->m_compassCalEllipsoidValid & 1U) != 0) {
      local_34 = *(undefined1 (*) [8])(this->m_imuData).compass.m_data;
      ev.m_data[0] = (this->m_imuData).compass.m_data[2];
      RTVector3::operator-=((RTVector3 *)local_34,&this->m_settings->m_compassCalEllipsoidOffset);
      RVar5 = RTVector3::x((RTVector3 *)local_34);
      fVar1 = this->m_settings->m_compassCalEllipsoidCorr[0][0];
      RVar7 = RTVector3::y((RTVector3 *)local_34);
      fVar2 = this->m_settings->m_compassCalEllipsoidCorr[0][1];
      RVar6 = RTVector3::z((RTVector3 *)local_34);
      RTVector3::setX(&(this->m_imuData).compass,
                      RVar6 * this->m_settings->m_compassCalEllipsoidCorr[0][2] +
                      RVar5 * fVar1 + RVar7 * fVar2);
      RVar5 = RTVector3::x((RTVector3 *)local_34);
      fVar1 = this->m_settings->m_compassCalEllipsoidCorr[1][0];
      RVar7 = RTVector3::y((RTVector3 *)local_34);
      fVar2 = this->m_settings->m_compassCalEllipsoidCorr[1][1];
      RVar6 = RTVector3::z((RTVector3 *)local_34);
      RTVector3::setY(&(this->m_imuData).compass,
                      RVar6 * this->m_settings->m_compassCalEllipsoidCorr[1][2] +
                      RVar5 * fVar1 + RVar7 * fVar2);
      RVar5 = RTVector3::x((RTVector3 *)local_34);
      fVar1 = this->m_settings->m_compassCalEllipsoidCorr[2][0];
      RVar7 = RTVector3::y((RTVector3 *)local_34);
      fVar2 = this->m_settings->m_compassCalEllipsoidCorr[2][1];
      RVar6 = RTVector3::z((RTVector3 *)local_34);
      RTVector3::setZ(&(this->m_imuData).compass,
                      RVar6 * this->m_settings->m_compassCalEllipsoidCorr[2][2] +
                      RVar5 * fVar1 + RVar7 * fVar2);
    }
  }
  RVar5 = RTVector3::x(&(this->m_imuData).compass);
  RVar7 = RTVector3::x(&this->m_compassAverage);
  RTVector3::setX(&this->m_compassAverage,RVar7 * 0.8 + RVar5 * 0.2);
  RVar5 = RTVector3::y(&(this->m_imuData).compass);
  RVar7 = RTVector3::y(&this->m_compassAverage);
  RTVector3::setY(&this->m_compassAverage,RVar7 * 0.8 + RVar5 * 0.2);
  RVar5 = RTVector3::z(&(this->m_imuData).compass);
  RVar7 = RTVector3::z(&this->m_compassAverage);
  RTVector3::setZ(&this->m_compassAverage,RVar7 * 0.8 + RVar5 * 0.2);
  RTVector3::operator=(&(this->m_imuData).compass,&this->m_compassAverage);
  return;
}

Assistant:

void RTIMU::calibrateAverageCompass()
{
    //  see if need to do runtime mag calibration (i.e. no stored calibration data)

    if (!m_compassCalibrationMode && !m_settings->m_compassCalValid) {
        // try runtime calibration
        bool changed = false;

        // see if there is a new max or min

        if (m_runtimeMagCalMax[0] < m_imuData.compass.x()) {
            m_runtimeMagCalMax[0] = m_imuData.compass.x();
            changed = true;
        }
        if (m_runtimeMagCalMax[1] < m_imuData.compass.y()) {
            m_runtimeMagCalMax[1] = m_imuData.compass.y();
            changed = true;
        }
        if (m_runtimeMagCalMax[2] < m_imuData.compass.z()) {
            m_runtimeMagCalMax[2] = m_imuData.compass.z();
            changed = true;
        }

        if (m_runtimeMagCalMin[0] > m_imuData.compass.x()) {
            m_runtimeMagCalMin[0] = m_imuData.compass.x();
            changed = true;
        }
        if (m_runtimeMagCalMin[1] > m_imuData.compass.y()) {
            m_runtimeMagCalMin[1] = m_imuData.compass.y();
            changed = true;
        }
        if (m_runtimeMagCalMin[2] > m_imuData.compass.z()) {
            m_runtimeMagCalMin[2] = m_imuData.compass.z();
            changed = true;
        }

        //  now see if ranges are sufficient

        if (changed) {

            float delta;

            if (!m_runtimeMagCalValid) {
                m_runtimeMagCalValid = true;

                for (int i = 0; i < 3; i++)
                {
                    delta = m_runtimeMagCalMax[i] - m_runtimeMagCalMin[i];
                    if ((delta < RTIMU_RUNTIME_MAGCAL_RANGE) || (m_runtimeMagCalMin[i] > 0) || (m_runtimeMagCalMax[i] < 0))
                    {
                        m_runtimeMagCalValid = false;
                        break;
                    }
                }
            }

            //  find biggest range and scale to that

            if (m_runtimeMagCalValid) {
                float magMaxDelta = -1;

                for (int i = 0; i < 3; i++) {
                    if ((m_runtimeMagCalMax[i] - m_runtimeMagCalMin[i]) > magMaxDelta)
                    {
                        magMaxDelta = m_runtimeMagCalMax[i] - m_runtimeMagCalMin[i];
                    }
                }

                // adjust for + and - range

                magMaxDelta /= 2.0;

                for (int i = 0; i < 3; i++)
                {
                    delta = (m_runtimeMagCalMax[i] - m_runtimeMagCalMin[i]) / 2.0;
                    m_compassCalScale[i] = magMaxDelta / delta;
                    m_compassCalOffset[i] = (m_runtimeMagCalMax[i] + m_runtimeMagCalMin[i]) / 2.0;
                }
            }
        }
    }

    if (getCompassCalibrationValid() || getRuntimeCompassCalibrationValid()) {
        m_imuData.compass.setX((m_imuData.compass.x() - m_compassCalOffset[0]) * m_compassCalScale[0]);
        m_imuData.compass.setY((m_imuData.compass.y() - m_compassCalOffset[1]) * m_compassCalScale[1]);
        m_imuData.compass.setZ((m_imuData.compass.z() - m_compassCalOffset[2]) * m_compassCalScale[2]);

        if (m_settings->m_compassCalEllipsoidValid) {
            RTVector3 ev = m_imuData.compass;
            ev -= m_settings->m_compassCalEllipsoidOffset;

            m_imuData.compass.setX(ev.x() * m_settings->m_compassCalEllipsoidCorr[0][0] +
                ev.y() * m_settings->m_compassCalEllipsoidCorr[0][1] +
                ev.z() * m_settings->m_compassCalEllipsoidCorr[0][2]);

            m_imuData.compass.setY(ev.x() * m_settings->m_compassCalEllipsoidCorr[1][0] +
                ev.y() * m_settings->m_compassCalEllipsoidCorr[1][1] +
                ev.z() * m_settings->m_compassCalEllipsoidCorr[1][2]);

            m_imuData.compass.setZ(ev.x() * m_settings->m_compassCalEllipsoidCorr[2][0] +
                ev.y() * m_settings->m_compassCalEllipsoidCorr[2][1] +
                ev.z() * m_settings->m_compassCalEllipsoidCorr[2][2]);
        }
    }

    //  update running average

    m_compassAverage.setX(m_imuData.compass.x() * COMPASS_ALPHA + m_compassAverage.x() * (1.0 - COMPASS_ALPHA));
    m_compassAverage.setY(m_imuData.compass.y() * COMPASS_ALPHA + m_compassAverage.y() * (1.0 - COMPASS_ALPHA));
    m_compassAverage.setZ(m_imuData.compass.z() * COMPASS_ALPHA + m_compassAverage.z() * (1.0 - COMPASS_ALPHA));

    m_imuData.compass = m_compassAverage;
}